

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

ssize_t __thiscall
xmrig::Threads<xmrig::OclThreads>::read
          (Threads<xmrig::OclThreads> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  MemberIterator MVar2;
  Reference pVVar3;
  size_type sVar4;
  undefined4 in_register_00000034;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *member_1;
  MemberIterator __end1_1;
  MemberIterator __begin1_1;
  ConstObject *__range1_1;
  OclThreads threads;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *member;
  MemberIterator __end1;
  MemberIterator __begin1;
  ConstObject *__range1;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  OclThreads *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  Threads<xmrig::OclThreads> *in_stack_ffffffffffffff78;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_80;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_78;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_70;
  Value *in_stack_ffffffffffffffa8;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_20;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_18;
  undefined8 local_10;
  Threads<xmrig::OclThreads> *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  local_18 = &local_20;
  local_28.ptr_ =
       (Pointer)rapidjson::
                GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                ::begin((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                         *)CONCAT17(in_stack_fffffffffffffeff,
                                    CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  MVar2 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::end((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                 *)CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  while (bVar1 = rapidjson::
                 GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator!=(&local_28,(ConstIterator)MVar2.ptr_), bVar1) {
    pVVar3 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator*(&local_28);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(&pVVar3->value);
    if ((bVar1) ||
       (bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsObject(&pVVar3->value), bVar1)) {
      OclThreads::OclThreads((OclThreads *)pVVar3,in_stack_ffffffffffffffa8);
      bVar1 = OclThreads::isEmpty((OclThreads *)0x1f3eab);
      if (!bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(&pVVar3->name);
        move(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      OclThreads::~OclThreads((OclThreads *)0x1f3f1a);
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_28);
  }
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericObject(&local_20);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  local_70 = &local_78;
  local_80.ptr_ =
       (Pointer)rapidjson::
                GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                ::begin((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                         *)CONCAT17(in_stack_fffffffffffffeff,
                                    CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  MVar2 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::end((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                 *)CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  while (bVar1 = rapidjson::
                 GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator!=(&local_80,(ConstIterator)MVar2.ptr_), bVar1) {
    pVVar3 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator*(&local_80);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(&pVVar3->value);
    if (!bVar1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::IsObject(&pVVar3->value);
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_80);
  }
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericObject(&local_78);
  sVar4 = std::
          map<xmrig::String,_xmrig::OclThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
          ::size((map<xmrig::String,_xmrig::OclThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
                  *)0x1f408e);
  return sVar4;
}

Assistant:

size_t xmrig::Threads<T>::read(const rapidjson::Value &value)
{
    using namespace rapidjson;

    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            T threads(member.value);

            if (!threads.isEmpty()) {
                move(member.name.GetString(), std::move(threads));
            }
        }
    }
    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            continue;
        }
    }

    return m_profiles.size();
}